

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

UtxoData * __thiscall
cfd::ConfidentialTransactionContext::GetTxInUtxoData
          (UtxoData *__return_storage_ptr__,ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  UtxoData::UtxoData(__return_storage_ptr__);
  __return_storage_ptr__->address_type = kP2shAddress;
  __return_storage_ptr__->vout = 0;
  __return_storage_ptr__->block_height = 0;
  __return_storage_ptr__->binary_data = (void *)0x0;
  IsFindUtxoMap(this,outpoint,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UtxoData ConfidentialTransactionContext::GetTxInUtxoData(
    const OutPoint& outpoint) const {
  UtxoData utxo;
  utxo.address_type = AddressType::kP2shAddress;
  utxo.vout = 0;
  utxo.block_height = 0;
  utxo.binary_data = nullptr;
  IsFindUtxoMap(outpoint, &utxo);
  return utxo;
}